

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O2

const_iterator
cmRemoveDuplicates<std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
          (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *r)

{
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  __position;
  const_iterator cVar1;
  cmSourceFile **ppcVar2;
  size_t count;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> unique;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  cmSourceFile *local_88;
  value_type_conflict1 local_80;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_78;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *local_38;
  
  local_78._M_impl.super__Vector_impl_data._M_start = (cmSourceFile **)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (cmSourceFile **)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::reserve
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_78,
             (long)(r->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(r->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = 0;
  cVar1._M_current =
       (r->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = r;
  for (ppcVar2 = (r->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppcVar2 != cVar1._M_current;
      ppcVar2 = ppcVar2 + 1) {
    local_88 = *ppcVar2;
    __position = std::
                 __lower_bound<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,cmSourceFile*,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(cmSourceFile*,cmSourceFile*)>>
                           ((__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                             )local_78._M_impl.super__Vector_impl_data._M_start,
                            (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                             )local_78._M_impl.super__Vector_impl_data._M_finish,&local_88,
                            (_Iter_comp_val<bool_(*)(cmSourceFile_*,_cmSourceFile_*)>)0x329392);
    if ((__position._M_current == local_78._M_impl.super__Vector_impl_data._M_finish) ||
       (*__position._M_current != *ppcVar2)) {
      local_88 = *ppcVar2;
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::_M_insert_rval
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_78,
                 (const_iterator)__position._M_current,&local_88);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,&local_80);
    }
    local_80 = local_80 + 1;
  }
  if (local_58._M_impl.super__Vector_impl_data._M_start !=
      local_58._M_impl.super__Vector_impl_data._M_finish) {
    cVar1 = cmRemoveIndices<std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                      (local_38,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_58);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base(&local_78);
  return (const_iterator)cVar1._M_current;
}

Assistant:

typename Range::const_iterator cmRemoveDuplicates(Range& r)
{
  typedef typename ContainerAlgorithms::RemoveDuplicatesAPI<Range> API;
  typedef typename API::value_type T;
  std::vector<T> unique;
  unique.reserve(r.size());
  std::vector<size_t> indices;
  size_t count = 0;
  const typename Range::const_iterator end = r.end();
  for(typename Range::const_iterator it = r.begin();
      it != end; ++it, ++count)
    {
    const typename std::vector<T>::iterator low =
        std::lower_bound(unique.begin(), unique.end(),
                         API::uniqueValue(it), API::lessThan);
    if (low == unique.end() || API::valueCompare(low, it))
      {
      unique.insert(low, API::uniqueValue(it));
      }
    else
      {
      indices.push_back(count);
      }
    }
  if (indices.empty())
    {
    return end;
    }
  return cmRemoveIndices(r, indices);
}